

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

Node * __thiscall Fl_Preferences::Node::childNode(Node *this,int ix)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  bool bVar4;
  
  createIndex(this);
  if ((this->field_0x30 & 4) == 0) {
    pNVar1 = this->child_;
    if (pNVar1 == (Node *)0x0) {
      pNVar1 = (Node *)0x0;
    }
    else {
      iVar3 = ix + 2;
      pNVar2 = pNVar1;
      do {
        pNVar2 = pNVar2->next_;
        iVar3 = iVar3 + -1;
      } while (pNVar2 != (Node *)0x0);
      if (iVar3 != 1 && pNVar1 != (Node *)0x0) {
        do {
          pNVar1 = pNVar1->next_;
          if (pNVar1 == (Node *)0x0) {
            return (Node *)0x0;
          }
          bVar4 = iVar3 != 0;
          iVar3 = iVar3 + 1;
        } while (bVar4);
      }
    }
  }
  else {
    pNVar1 = this->index_[ix];
  }
  return pNVar1;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::childNode( int ix ) {
  createIndex();
  if (indexed_) {
    // usually faster access in correct order, but needing more memory
    return index_[ix];
  } else {
    // slow access and reverse order
    int n = nChildren();
    ix = n - ix -1;
    Node *nd;
    for ( nd = child_; nd; nd = nd->next_ ) {
      if ( !ix-- ) break;
      if ( !nd ) break;
    }
    return nd;
  }
}